

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

LogicalType *
duckdb::GetUserTypeRecursive
          (LogicalType *__return_storage_ptr__,LogicalType *type,ClientContext *context)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  optional_ptr<duckdb::TypeCatalogEntry,_true> oVar2;
  bool bVar3;
  LogicalTypeId LVar4;
  LogicalType *pLVar5;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  child_list_t<LogicalType> children;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::TypeCatalogEntry,_true> entry;
  string local_e8;
  string local_c0;
  optional_ptr<duckdb::TypeCatalogEntry,_true> local_a0;
  LogicalType local_98;
  LogicalType local_80;
  child_list_t<LogicalType> local_68;
  string local_50;
  
  this = &local_e8;
  LVar4 = type->id_;
  if (LVar4 == USER) {
    bVar3 = LogicalType::HasAlias(type);
    if (!bVar3) {
      LVar4 = type->id_;
      goto LAB_00e709a4;
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,anon_var_dwarf_6372561 + 9);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,anon_var_dwarf_6372561 + 9);
    LogicalType::GetAlias_abi_cxx11_(&local_50,type);
    local_a0 = Catalog::GetEntry<duckdb::TypeCatalogEntry>
                         (context,&local_e8,&local_c0,&local_50,THROW_EXCEPTION,
                          (QueryErrorContext)0xffffffffffffffff);
    optional_ptr<duckdb::TypeCatalogEntry,_true>::CheckValid(&local_a0);
    oVar2.ptr = local_a0.ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    type = &(oVar2.ptr)->user_type;
LAB_00e70b33:
    LogicalType::LogicalType(__return_storage_ptr__,type);
  }
  else {
LAB_00e709a4:
    if (LVar4 == MAP) {
      pLVar5 = MapType::KeyType(type);
      GetUserTypeRecursive(&local_80,pLVar5,context);
      pLVar5 = MapType::ValueType(type);
      GetUserTypeRecursive(&local_98,pLVar5,context);
      LogicalType::MAP(__return_storage_ptr__,&local_80,&local_98);
      LogicalType::~LogicalType(&local_98);
      this = (string *)&local_80;
    }
    else {
      if (LVar4 != LIST) {
        if (LVar4 == STRUCT) {
          local_e8._M_dataplus._M_p = (pointer)0x0;
          local_e8._M_string_length = 0;
          local_e8.field_2._M_allocated_capacity = 0;
          local_c0._M_dataplus._M_p =
               (pointer)(type->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_c0);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)&local_e8,
                    (*(long *)(local_c0._M_dataplus._M_p + 0x40) -
                     (long)((element_type *)(local_c0._M_dataplus._M_p + 0x38))->_vptr_ExtraTypeInfo
                    >> 3) * 0x6db6db6db6db6db7);
          local_c0._M_dataplus._M_p =
               (pointer)(type->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_c0);
          __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((element_type *)(local_c0._M_dataplus._M_p + 0x38))->_vptr_ExtraTypeInfo;
          pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (local_c0._M_dataplus._M_p + 0x40);
          if (__args != pbVar1) {
            do {
              GetUserTypeRecursive((LogicalType *)&local_c0,(LogicalType *)(__args + 1),context);
              ::std::
              vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType>
                        ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                          *)&local_e8,__args,(LogicalType *)&local_c0);
              LogicalType::~LogicalType((LogicalType *)&local_c0);
              __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&__args[1].field_2 + 8);
            } while (__args != pbVar1);
          }
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)&local_68,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)&local_e8);
          LogicalType::STRUCT(__return_storage_ptr__,&local_68);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)&local_68);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)&local_e8);
          return __return_storage_ptr__;
        }
        goto LAB_00e70b33;
      }
      local_c0._M_dataplus._M_p =
           (pointer)(type->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
                ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_c0);
      GetUserTypeRecursive
                ((LogicalType *)&local_e8,(LogicalType *)(local_c0._M_dataplus._M_p + 0x38),context)
      ;
      LogicalType::LIST(__return_storage_ptr__,(LogicalType *)&local_e8);
    }
    LogicalType::~LogicalType((LogicalType *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType GetUserTypeRecursive(const LogicalType &type, ClientContext &context) {
	if (type.id() == LogicalTypeId::USER && type.HasAlias()) {
		auto &type_entry =
		    Catalog::GetEntry<TypeCatalogEntry>(context, INVALID_CATALOG, INVALID_SCHEMA, type.GetAlias());
		return type_entry.user_type;
	}
	// Look for LogicalTypeId::USER in nested types
	if (type.id() == LogicalTypeId::STRUCT) {
		child_list_t<LogicalType> children;
		children.reserve(StructType::GetChildCount(type));
		for (auto &child : StructType::GetChildTypes(type)) {
			children.emplace_back(child.first, GetUserTypeRecursive(child.second, context));
		}
		return LogicalType::STRUCT(children);
	}
	if (type.id() == LogicalTypeId::LIST) {
		return LogicalType::LIST(GetUserTypeRecursive(ListType::GetChildType(type), context));
	}
	if (type.id() == LogicalTypeId::MAP) {
		return LogicalType::MAP(GetUserTypeRecursive(MapType::KeyType(type), context),
		                        GetUserTypeRecursive(MapType::ValueType(type), context));
	}
	// Not LogicalTypeId::USER or a nested type
	return type;
}